

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O3

Array __thiscall notch::pre::OneHotEncoder::unapply(OneHotEncoder *this,Array *input)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  pointer __s;
  float **ppfVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  invalid_argument *this_00;
  float **ppfVar10;
  long *in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar11;
  long lVar12;
  float *extraout_RDX_01;
  long lVar13;
  int iVar14;
  size_t outCol;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  Array AVar19;
  ostringstream ss;
  string local_1c8 [32];
  int local_1a8 [94];
  
  pfVar2 = (float *)*in_RDX;
  pfVar3 = input[5]._M_data;
  if (pfVar2 != (float *)(input[5]._M_size + (long)pfVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"input.size(): ",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", expected: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,local_1c8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (this->super_ADatasetTransformer)._vptr_ADatasetTransformer =
       (_func_int **)((long)pfVar2 - (long)pfVar3);
  __s = (pointer)operator_new(((long)pfVar2 - (long)pfVar3) * 4);
  (this->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = __s;
  pfVar11 = extraout_RDX;
  if (pfVar2 != pfVar3) {
    lVar15 = 0;
    memset(__s,0,(long)pfVar2 * 4 + (long)pfVar3 * -4);
    lVar17 = 0;
    pfVar11 = extraout_RDX_00;
    do {
      ppfVar7 = (float **)input[3]._M_size;
      ppfVar10 = &input[2]._M_data;
      if (ppfVar7 == (float **)0x0) {
LAB_0017fed6:
        __s[lVar15] = *(int *)(in_RDX[1] + lVar17 * 4);
        lVar13 = 1;
      }
      else {
        do {
          iVar14 = (int)lVar15;
          pfVar11 = (float *)(ulong)(*(int *)(ppfVar7 + 4) < iVar14);
          if (iVar14 <= *(int *)(ppfVar7 + 4)) {
            ppfVar10 = ppfVar7;
          }
          ppfVar7 = (float **)ppfVar7[(long)pfVar11 + 2];
        } while (ppfVar7 != (float **)0x0);
        if ((ppfVar10 == &input[2]._M_data) || (iVar14 < *(int *)(ppfVar10 + 4))) goto LAB_0017fed6;
        local_1a8[0] = iVar14;
        pmVar8 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)(input + 2),local_1a8);
        piVar4 = (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar5 = (pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)piVar4 - (long)piVar5 >> 2;
        if (piVar4 == piVar5) {
          lVar16 = 0;
        }
        else {
          lVar12 = 0;
          lVar16 = 0;
          fVar18 = -3.4028235e+38;
          do {
            fVar1 = *(float *)(lVar17 * 4 + in_RDX[1] + lVar12 * 4);
            lVar6 = lVar12;
            if (fVar1 <= fVar18) {
              fVar1 = fVar18;
              lVar6 = lVar16;
            }
            lVar16 = lVar6;
            fVar18 = fVar1;
            lVar12 = lVar12 + 1;
          } while (lVar13 + (ulong)(lVar13 == 0) != lVar12);
        }
        local_1a8[0] = iVar14;
        pmVar8 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)(input + 2),local_1a8);
        __s[lVar15] = (int)(float)(pmVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar16];
        pfVar11 = extraout_RDX_01;
      }
      lVar17 = lVar17 + lVar13;
      lVar15 = lVar15 + 1;
    } while (lVar15 != (long)pfVar2 - (long)pfVar3);
  }
  AVar19._M_data = pfVar11;
  AVar19._M_size = (size_t)this;
  return AVar19;
}

Assistant:

virtual Array unapply(const Array &input) {
        if (input.size() != nInputCols + nExtraCols) {
            std::ostringstream ss;
            ss << "input.size(): " << input.size()
               << ", expected: " << nInputCols + nExtraCols;
            throw std::invalid_argument(ss.str());
        }
        Array output(0.0, input.size() - nExtraCols);
        size_t inCol = 0;
        for (size_t outCol = 0; outCol < output.size(); ++outCol) {
            if (columnValues.count(outCol)) { // replace with one column
                // find the column with the largest output
                size_t nColsPerFeature = columnValues[outCol].size();
                float maxVal = std::numeric_limits<float>::lowest();
                size_t maxIdx = 0;
                for (size_t i = 0; i < nColsPerFeature; ++i) {
                    if (input[inCol + i] > maxVal) {
                        maxVal = input[inCol + i];
                        maxIdx = i;
                    }
                }
                // use the category corresponding to the largest value
                output[outCol] = columnValues[outCol][maxIdx];
                inCol += nColsPerFeature;
            } else {
                output[outCol] = input[inCol];
                ++inCol;
            }
        }
        return output;
    }